

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O2

void __thiscall QWidgetWindow::setNativeWindowVisibility(QWidgetWindow *this,bool visible)

{
  undefined8 uVar1;
  QLoggingCategory *pQVar2;
  QDebug *pQVar3;
  long in_FS_OFFSET;
  QDebug local_50;
  Stream *local_48;
  undefined1 local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(undefined8 *)&this->field_0x8;
  pQVar2 = QtPrivateLogging::lcWidgetShowHide();
  if (((pQVar2->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    QMessageLogger::debug();
    pQVar3 = QDebug::operator<<(&local_50,"Setting visibility of");
    local_48 = pQVar3->stream;
    *(int *)(local_48 + 0x28) = *(int *)(local_48 + 0x28) + 1;
    ::operator<<((Stream *)local_40,(QWindow *)&local_48);
    pQVar3 = QDebug::operator<<((QDebug *)local_40,"to");
    pQVar3 = QDebug::operator<<(pQVar3,visible);
    QDebug::operator<<(pQVar3,"via QWidgetWindow::setNativeWindowVisibility");
    QDebug::~QDebug((QDebug *)local_40);
    QDebug::~QDebug((QDebug *)&local_48);
    QDebug::~QDebug(&local_50);
  }
  QWindowPrivate::setVisible(SUB81(uVar1,0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::setNativeWindowVisibility(bool visible)
{
    Q_D(QWidgetWindow);
    qCDebug(lcWidgetShowHide) << "Setting visibility of" << this
        << "to" << visible << "via QWidgetWindow::setNativeWindowVisibility";

    // Call base class setVisible() implementation to run the QWindow
    // visibility logic. Don't call QWidgetWindowPrivate::setVisible()
    // since that will recurse back into QWidget code.
    d->QWindowPrivate::setVisible(visible);
}